

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O3

void __thiscall
SketchImpl<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>_>
::Serialize(SketchImpl<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>_>
            *this,uchar *ptr)

{
  long lVar1;
  uint *puVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint *val;
  uint *puVar7;
  byte bVar8;
  uint uVar9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar7 = (this->m_syndromes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->m_syndromes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar2) {
    bVar8 = 0;
    iVar4 = 0;
    do {
      uVar9 = *puVar7;
      uVar6 = 0x20;
      if (iVar4 < -0x18) {
LAB_00b31466:
        do {
          *ptr = (byte)uVar9;
          ptr = ptr + 1;
          uVar9 = uVar9 >> 8;
          uVar5 = uVar6 - 8;
          bVar3 = 0xf < uVar6;
          uVar6 = uVar5;
        } while (bVar3);
      }
      else {
        *ptr = bVar8 | (byte)(uVar9 << ((byte)iVar4 & 0x1f));
        ptr = ptr + 1;
        uVar9 = uVar9 >> (8 - (byte)iVar4 & 0x1f);
        uVar5 = iVar4 + 0x18;
        iVar4 = 0;
        bVar8 = 0;
        uVar6 = uVar5;
        if (7 < (int)uVar5) goto LAB_00b31466;
      }
      bVar8 = (byte)((~(-1 << ((byte)uVar5 & 0x1f)) & uVar9) << ((byte)iVar4 & 0x1f)) | bVar8;
      iVar4 = uVar5 + iVar4;
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar2);
    if (iVar4 != 0) {
      *ptr = bVar8;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(unsigned char* ptr) const override
    {
        BitWriter writer(ptr);
        for (const auto& val : m_syndromes) {
            m_field.Serialize(writer, val);
        }
        writer.Flush();
    }